

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall
sptk::reaper::EpochTracker::CrossCorrelation
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,int32_t start,
          int32_t first_lag,int32_t n_lags,int32_t size,vector<float,_std::allocator<float>_> *corr)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  
  pfVar9 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start + start;
  std::vector<float,_std::allocator<float>_>::resize(corr,(long)n_lags);
  uVar3 = 0;
  uVar7 = 0;
  if (0 < size) {
    uVar7 = (ulong)(uint)size;
  }
  fVar12 = 0.0;
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    fVar12 = fVar12 + pfVar9[uVar3] * pfVar9[uVar3];
  }
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    dVar1 = 0.0;
    lVar8 = (long)first_lag;
    for (lVar5 = lVar8; lVar5 < size + first_lag; lVar5 = lVar5 + 1) {
      dVar1 = dVar1 + (double)(pfVar9[lVar5] * pfVar9[lVar5]);
    }
    lVar5 = lVar8 + uVar7;
    lVar6 = lVar8 * 4;
    lVar10 = 0;
    for (; lVar8 < n_lags + first_lag; lVar8 = lVar8 + 1) {
      fVar13 = 0.0;
      pfVar4 = pfVar9;
      uVar3 = uVar7;
      while (bVar11 = uVar3 != 0, uVar3 = uVar3 - 1, bVar11) {
        fVar13 = fVar13 + *pfVar4 * *(float *)((long)pfVar4 + lVar6);
        pfVar4 = pfVar4 + 1;
      }
      dVar1 = (double)((ulong)(~(uint)(-(ulong)(0.0 < dVar1) >> 0x20) & 0x3ff00000) << 0x20 |
                      (ulong)dVar1 & -(ulong)(0.0 < dVar1));
      dVar2 = dVar1 * (double)fVar12;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      (corr->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = (float)((double)fVar13 / dVar2);
      dVar1 = (double)(pfVar9[(int)lVar5] * pfVar9[(int)lVar5]) +
              (dVar1 - (double)(pfVar9[lVar8] * pfVar9[lVar8]));
      lVar10 = lVar10 + 1;
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 4;
    }
  }
  else {
    uVar7 = 0;
    uVar3 = (ulong)(uint)n_lags;
    if (n_lags < 1) {
      uVar3 = uVar7;
    }
    for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      (corr->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar7] = 0.0;
    }
  }
  return;
}

Assistant:

void EpochTracker::CrossCorrelation(const std::vector<float>& data, int32_t start,
                                    int32_t first_lag, int32_t n_lags,
                                    int32_t size, std::vector<float>* corr) {
  const float* input = (&(data.front())) + start;
  corr->resize(n_lags);
  float energy = 0.0;  // Zero-lag energy part of the normalizer.
  for (int32_t i = 0; i < size; ++i) {
    energy += input[i] * input[i];
  }
  if (energy == 0.0) {  // Bail out if no energy is found.
    for (int32_t i = 0; i < n_lags; ++i) {
      (*corr)[i] = 0.0;
    }
    return;
  }
  int32_t limit = first_lag + size;
  double lag_energy = 0.0;  // Energy at the period hypothesis lag.
  for (int32_t i = first_lag; i < limit; ++i) {
    lag_energy += input[i] * input[i];
  }
  int32_t last_lag = first_lag + n_lags;
  int32_t oind = 0;  // Index for storing output values.
  for (int32_t lag = first_lag; lag < last_lag; ++lag, ++oind) {
    float sum = 0.0;
    int32_t lag_ind = lag;
    for (int32_t i = 0; i < size; ++i, ++lag_ind) {
      sum += input[i] * input[lag_ind];
    }
    if (lag_energy <= 0.0)
      lag_energy = 1.0;
    (*corr)[oind] = sum / sqrt(energy * lag_energy);
    lag_energy -= input[lag] * input[lag];  // Discard old sample.
    lag_energy += input[lag_ind] * input[lag_ind];  // Pick up the new sample.
  }
  return;
}